

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  Scene *pSVar34;
  bool bVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar56;
  float fVar59;
  float fVar62;
  undefined1 auVar48 [16];
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar91;
  float fVar92;
  undefined1 auVar88 [16];
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar106;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar137;
  float fVar140;
  undefined1 auVar133 [16];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar152;
  float fVar153;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  undefined1 auVar155 [64];
  float fVar157;
  undefined1 auVar156 [64];
  float fVar164;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  Scene *local_430;
  RayK<8> *local_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  Primitive *local_388;
  RTCFilterFunctionNArguments local_380;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [8];
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [16];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar34 = context->scene;
  uVar31 = line->sharedGeomID;
  uVar33 = (line->v0).field_0.i[0];
  pGVar6 = (pSVar34->geometries).items[uVar31].ptr;
  fVar94 = (pGVar6->time_range).lower;
  fVar94 = pGVar6->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar94) / ((pGVar6->time_range).upper - fVar94));
  auVar38 = vroundss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94),9);
  auVar38 = vminss_avx(auVar38,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar95 = vmaxss_avx(ZEXT816(0),auVar38);
  lVar7 = *(long *)&pGVar6[3].time_range.upper;
  lVar36 = (long)(int)auVar95._0_4_ * 0x38;
  lVar8 = *(long *)(lVar7 + lVar36);
  lVar9 = *(long *)(lVar7 + 0x10 + lVar36);
  auVar38 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)uVar33);
  uVar3 = (line->v0).field_0.i[1];
  auVar51 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)uVar3);
  uVar4 = (line->v0).field_0.i[2];
  auVar74 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)uVar4);
  uVar5 = (line->v0).field_0.i[3];
  auVar39 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)uVar5);
  auVar48 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar33 + 1));
  auVar65 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar3 + 1));
  auVar37 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar4 + 1));
  auVar40 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar5 + 1));
  lVar8 = *(long *)(lVar7 + 0x38 + lVar36);
  lVar7 = *(long *)(lVar7 + 0x48 + lVar36);
  auVar66 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar33 * lVar7);
  auVar67 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar3 * lVar7);
  auVar75 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar4 * lVar7);
  auVar76 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar5 * lVar7);
  auVar88 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar33 + 1) * lVar7);
  auVar107 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar4 + 1) * lVar7);
  fVar94 = fVar94 - auVar95._0_4_;
  auVar95 = vunpcklps_avx(auVar38,auVar74);
  auVar38 = vunpckhps_avx(auVar38,auVar74);
  auVar74 = vunpcklps_avx(auVar51,auVar39);
  auVar51 = vunpckhps_avx(auVar51,auVar39);
  auVar108 = vunpcklps_avx(auVar95,auVar74);
  auVar74 = vunpckhps_avx(auVar95,auVar74);
  auVar95 = vunpcklps_avx(auVar38,auVar51);
  auVar39 = vunpckhps_avx(auVar38,auVar51);
  auVar109 = vunpcklps_avx(auVar48,auVar37);
  auVar38 = vunpckhps_avx(auVar48,auVar37);
  auVar48 = vunpcklps_avx(auVar65,auVar40);
  auVar51 = vunpckhps_avx(auVar65,auVar40);
  auVar110 = vunpcklps_avx(auVar109,auVar48);
  auVar48 = vunpckhps_avx(auVar109,auVar48);
  auVar109 = vunpcklps_avx(auVar38,auVar51);
  auVar65 = vunpckhps_avx(auVar38,auVar51);
  auVar37 = vunpcklps_avx(auVar66,auVar75);
  auVar38 = vunpckhps_avx(auVar66,auVar75);
  auVar40 = vunpcklps_avx(auVar67,auVar76);
  auVar51 = vunpckhps_avx(auVar67,auVar76);
  auVar75 = vunpcklps_avx(auVar37,auVar40);
  auVar37 = vunpckhps_avx(auVar37,auVar40);
  auVar76 = vunpcklps_avx(auVar38,auVar51);
  auVar40 = vunpckhps_avx(auVar38,auVar51);
  auVar67 = vunpcklps_avx(auVar88,auVar107);
  auVar66 = vunpckhps_avx(auVar88,auVar107);
  auVar38 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar3 + 1) * lVar7);
  auVar51 = *(undefined1 (*) [16])(lVar8 + lVar7 * (ulong)(uVar5 + 1));
  auVar88 = vunpcklps_avx(auVar38,auVar51);
  auVar38 = vunpckhps_avx(auVar38,auVar51);
  auVar107 = vunpcklps_avx(auVar67,auVar88);
  auVar67 = vunpckhps_avx(auVar67,auVar88);
  auVar88 = vunpcklps_avx(auVar66,auVar38);
  auVar66 = vunpckhps_avx(auVar66,auVar38);
  auVar38 = vshufps_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94),0);
  auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar94)),ZEXT416((uint)(1.0 - fVar94)),0);
  fVar94 = auVar38._0_4_;
  fVar106 = auVar38._4_4_;
  fVar157 = auVar38._8_4_;
  fVar45 = auVar38._12_4_;
  fVar56 = auVar51._0_4_;
  fVar59 = auVar51._4_4_;
  fVar62 = auVar51._8_4_;
  fVar164 = auVar51._12_4_;
  auVar146._0_4_ = fVar56 * auVar108._0_4_ + fVar94 * auVar75._0_4_;
  auVar146._4_4_ = fVar59 * auVar108._4_4_ + fVar106 * auVar75._4_4_;
  auVar146._8_4_ = fVar62 * auVar108._8_4_ + fVar157 * auVar75._8_4_;
  auVar146._12_4_ = fVar164 * auVar108._12_4_ + fVar45 * auVar75._12_4_;
  local_440._0_4_ = fVar56 * auVar74._0_4_ + fVar94 * auVar37._0_4_;
  local_440._4_4_ = fVar59 * auVar74._4_4_ + fVar106 * auVar37._4_4_;
  fStack_438 = fVar62 * auVar74._8_4_ + fVar157 * auVar37._8_4_;
  fStack_434 = fVar164 * auVar74._12_4_ + fVar45 * auVar37._12_4_;
  local_480._0_4_ = auVar95._0_4_;
  local_480._4_4_ = auVar95._4_4_;
  fStack_478 = auVar95._8_4_;
  fStack_474 = auVar95._12_4_;
  auVar95._0_4_ = fVar56 * (float)local_480._0_4_ + fVar94 * auVar76._0_4_;
  auVar95._4_4_ = fVar59 * (float)local_480._4_4_ + fVar106 * auVar76._4_4_;
  auVar95._8_4_ = fVar62 * fStack_478 + fVar157 * auVar76._8_4_;
  auVar95._12_4_ = fVar164 * fStack_474 + fVar45 * auVar76._12_4_;
  auVar150._8_4_ = 0x3f800000;
  auVar150._0_8_ = 0x3f8000003f800000;
  auVar150._12_4_ = 0x3f800000;
  local_4b0._0_4_ = auVar39._0_4_;
  local_4b0._4_4_ = auVar39._4_4_;
  fStack_4a8 = auVar39._8_4_;
  fStack_4a4 = auVar39._12_4_;
  local_4b0._0_4_ = fVar56 * (float)local_4b0._0_4_ + fVar94 * auVar40._0_4_;
  local_4b0._4_4_ = fVar59 * (float)local_4b0._4_4_ + fVar106 * auVar40._4_4_;
  fStack_4a8 = fVar62 * fStack_4a8 + fVar157 * auVar40._8_4_;
  fStack_4a4 = fVar164 * fStack_4a4 + fVar45 * auVar40._12_4_;
  local_480._0_4_ = fVar56 * auVar110._0_4_ + fVar94 * auVar107._0_4_;
  local_480._4_4_ = fVar59 * auVar110._4_4_ + fVar106 * auVar107._4_4_;
  fStack_478 = fVar62 * auVar110._8_4_ + fVar157 * auVar107._8_4_;
  fStack_474 = fVar164 * auVar110._12_4_ + fVar45 * auVar107._12_4_;
  auVar133._0_4_ = fVar56 * auVar48._0_4_ + fVar94 * auVar67._0_4_;
  auVar133._4_4_ = fVar59 * auVar48._4_4_ + fVar106 * auVar67._4_4_;
  auVar133._8_4_ = fVar62 * auVar48._8_4_ + fVar157 * auVar67._8_4_;
  auVar133._12_4_ = fVar164 * auVar48._12_4_ + fVar45 * auVar67._12_4_;
  auVar120._0_4_ = fVar56 * auVar109._0_4_ + fVar94 * auVar88._0_4_;
  auVar120._4_4_ = fVar59 * auVar109._4_4_ + fVar106 * auVar88._4_4_;
  auVar120._8_4_ = fVar62 * auVar109._8_4_ + fVar157 * auVar88._8_4_;
  auVar120._12_4_ = fVar164 * auVar109._12_4_ + fVar45 * auVar88._12_4_;
  local_3a0 = auVar65._0_4_;
  fStack_39c = auVar65._4_4_;
  fStack_398 = auVar65._8_4_;
  fStack_394 = auVar65._12_4_;
  auVar37._0_4_ = fVar56 * local_3a0 + fVar94 * auVar66._0_4_;
  auVar37._4_4_ = fVar59 * fStack_39c + fVar106 * auVar66._4_4_;
  auVar37._8_4_ = fVar62 * fStack_398 + fVar157 * auVar66._8_4_;
  auVar37._12_4_ = fVar164 * fStack_394 + fVar45 * auVar66._12_4_;
  auVar38 = vpcmpeqd_avx(auVar37,auVar37);
  auVar51 = vpcmpeqd_avx(auVar38,(undefined1  [16])(line->primIDs).field_0);
  local_210 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
  local_220 = *(float *)(ray + k * 4 + 0x80);
  local_230 = *(float *)(ray + k * 4 + 0xa0);
  fStack_39c = *(float *)(ray + k * 4 + 0xc0);
  auVar38 = ZEXT416((uint)(local_220 * local_220 + local_230 * local_230 + fStack_39c * fStack_39c))
  ;
  auVar74 = vshufps_avx(auVar38,auVar38,0);
  auVar38 = vrcpps_avx(auVar74);
  fVar45 = auVar38._0_4_;
  auVar39._0_4_ = fVar45 * auVar74._0_4_;
  fVar56 = auVar38._4_4_;
  auVar39._4_4_ = fVar56 * auVar74._4_4_;
  fVar59 = auVar38._8_4_;
  auVar39._8_4_ = fVar59 * auVar74._8_4_;
  fVar62 = auVar38._12_4_;
  auVar39._12_4_ = fVar62 * auVar74._12_4_;
  auVar38 = vsubps_avx(auVar150,auVar39);
  auVar48._0_4_ = (auVar146._0_4_ + (float)local_480._0_4_) * 0.5;
  auVar48._4_4_ = (auVar146._4_4_ + (float)local_480._4_4_) * 0.5;
  auVar48._8_4_ = (auVar146._8_4_ + fStack_478) * 0.5;
  auVar48._12_4_ = (auVar146._12_4_ + fStack_474) * 0.5;
  auVar74._0_4_ = (auVar133._0_4_ + (float)local_440._0_4_) * 0.5;
  auVar74._4_4_ = (auVar133._4_4_ + (float)local_440._4_4_) * 0.5;
  auVar74._8_4_ = (auVar133._8_4_ + fStack_438) * 0.5;
  auVar74._12_4_ = (auVar133._12_4_ + fStack_434) * 0.5;
  auVar65._0_4_ = (auVar120._0_4_ + auVar95._0_4_) * 0.5;
  auVar65._4_4_ = (auVar120._4_4_ + auVar95._4_4_) * 0.5;
  auVar65._8_4_ = (auVar120._8_4_ + auVar95._8_4_) * 0.5;
  auVar65._12_4_ = (auVar120._12_4_ + auVar95._12_4_) * 0.5;
  fVar94 = *(float *)(ray + k * 4 + 0x20);
  auVar88._4_4_ = fVar94;
  auVar88._0_4_ = fVar94;
  auVar88._8_4_ = fVar94;
  auVar88._12_4_ = fVar94;
  auVar74 = vsubps_avx(auVar74,auVar88);
  fVar106 = *(float *)(ray + k * 4 + 0x40);
  auVar107._4_4_ = fVar106;
  auVar107._0_4_ = fVar106;
  auVar107._8_4_ = fVar106;
  auVar107._12_4_ = fVar106;
  auVar39 = vsubps_avx(auVar65,auVar107);
  fVar157 = *(float *)(ray + k * 4);
  auVar75._4_4_ = fVar157;
  auVar75._0_4_ = fVar157;
  auVar75._8_4_ = fVar157;
  auVar75._12_4_ = fVar157;
  auVar48 = vsubps_avx(auVar48,auVar75);
  fVar46 = (local_220 * auVar48._0_4_ + local_230 * auVar74._0_4_ + fStack_39c * auVar39._0_4_) *
           (fVar45 + fVar45 * auVar38._0_4_);
  fVar57 = (local_220 * auVar48._4_4_ + local_230 * auVar74._4_4_ + fStack_39c * auVar39._4_4_) *
           (fVar56 + fVar56 * auVar38._4_4_);
  fVar60 = (local_220 * auVar48._8_4_ + local_230 * auVar74._8_4_ + fStack_39c * auVar39._8_4_) *
           (fVar59 + fVar59 * auVar38._8_4_);
  fVar63 = (local_220 * auVar48._12_4_ + local_230 * auVar74._12_4_ + fStack_39c * auVar39._12_4_) *
           (fVar62 + fVar62 * auVar38._12_4_);
  auVar151._0_4_ = fVar157 + local_220 * fVar46;
  auVar151._4_4_ = fVar157 + local_220 * fVar57;
  auVar151._8_4_ = fVar157 + local_220 * fVar60;
  auVar151._12_4_ = fVar157 + local_220 * fVar63;
  auVar125._0_4_ = fVar94 + local_230 * fVar46;
  auVar125._4_4_ = fVar94 + local_230 * fVar57;
  auVar125._8_4_ = fVar94 + local_230 * fVar60;
  auVar125._12_4_ = fVar94 + local_230 * fVar63;
  auVar76._0_4_ = fVar106 + fStack_39c * fVar46;
  auVar76._4_4_ = fVar106 + fStack_39c * fVar57;
  auVar76._8_4_ = fVar106 + fStack_39c * fVar60;
  auVar76._12_4_ = fVar106 + fStack_39c * fVar63;
  local_310 = vsubps_avx(auVar133,_local_440);
  local_320 = vsubps_avx(auVar120,auVar95);
  fVar94 = local_320._0_4_;
  fVar62 = local_320._4_4_;
  fVar16 = local_320._8_4_;
  fVar22 = local_320._12_4_;
  fVar106 = local_310._0_4_;
  fVar164 = local_310._4_4_;
  fVar17 = local_310._8_4_;
  fVar23 = local_310._12_4_;
  local_240 = vsubps_avx(_local_480,auVar146);
  fVar157 = local_240._0_4_;
  fVar12 = local_240._4_4_;
  fVar18 = local_240._8_4_;
  fVar24 = local_240._12_4_;
  fVar47 = fVar157 * fVar157 + fVar106 * fVar106 + fVar94 * fVar94;
  fVar58 = fVar12 * fVar12 + fVar164 * fVar164 + fVar62 * fVar62;
  fVar61 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fVar64 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
  auVar74 = vsubps_avx(auVar125,_local_440);
  local_330 = vsubps_avx(auVar76,auVar95);
  fVar45 = local_330._0_4_;
  fVar13 = local_330._4_4_;
  fVar19 = local_330._8_4_;
  fVar25 = local_330._12_4_;
  fVar56 = auVar74._0_4_;
  fVar14 = auVar74._4_4_;
  fVar20 = auVar74._8_4_;
  fVar26 = auVar74._12_4_;
  _local_440 = vsubps_avx(auVar151,auVar146);
  fVar130 = local_440._0_4_;
  fVar137 = local_440._4_4_;
  fVar140 = local_440._8_4_;
  fVar143 = local_440._12_4_;
  fVar149 = fVar130 * fVar157 + fVar106 * fVar56 + fVar94 * fVar45;
  fVar152 = fVar137 * fVar12 + fVar164 * fVar14 + fVar62 * fVar13;
  fVar153 = fVar140 * fVar18 + fVar17 * fVar20 + fVar16 * fVar19;
  fVar154 = fVar143 * fVar24 + fVar23 * fVar26 + fVar22 * fVar25;
  auVar147._0_4_ = local_220 * fVar157 + local_230 * fVar106 + fVar94 * fStack_39c;
  auVar147._4_4_ = local_220 * fVar12 + local_230 * fVar164 + fVar62 * fStack_39c;
  auVar147._8_4_ = local_220 * fVar18 + local_230 * fVar17 + fVar16 * fStack_39c;
  auVar147._12_4_ = local_220 * fVar24 + local_230 * fVar23 + fVar22 * fStack_39c;
  local_3a0 = fStack_39c;
  fStack_398 = fStack_39c;
  fStack_394 = fStack_39c;
  fStack_22c = local_230;
  fStack_228 = local_230;
  fStack_224 = local_230;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  local_400._0_16_ = auVar74;
  auVar38 = vsubps_avx(_local_4b0,auVar37);
  fVar59 = auVar38._0_4_;
  fVar15 = auVar38._4_4_;
  fVar21 = auVar38._8_4_;
  fVar27 = auVar38._12_4_;
  fVar87 = fVar59 * fVar59 + fVar47;
  fVar91 = fVar15 * fVar15 + fVar58;
  fVar92 = fVar21 * fVar21 + fVar61;
  fVar93 = fVar27 * fVar27 + fVar64;
  local_250._0_4_ = fVar47 * fVar47;
  local_250._4_4_ = fVar58 * fVar58;
  fStack_248 = fVar61 * fVar61;
  fStack_244 = fVar64 * fVar64;
  auVar38._0_4_ =
       (float)local_250._0_4_ * (local_220 * fVar130 + local_230 * fVar56 + fStack_39c * fVar45);
  auVar38._4_4_ =
       (float)local_250._4_4_ * (local_220 * fVar137 + local_230 * fVar14 + fStack_39c * fVar13);
  auVar38._8_4_ = fStack_248 * (local_220 * fVar140 + local_230 * fVar20 + fStack_39c * fVar19);
  auVar38._12_4_ = fStack_244 * (local_220 * fVar143 + local_230 * fVar26 + fStack_39c * fVar25);
  auVar108._0_4_ = fVar87 * auVar147._0_4_ * fVar149;
  auVar108._4_4_ = fVar91 * auVar147._4_4_ * fVar152;
  auVar108._8_4_ = fVar92 * auVar147._8_4_ * fVar153;
  auVar108._12_4_ = fVar93 * auVar147._12_4_ * fVar154;
  auVar38 = vsubps_avx(auVar38,auVar108);
  auVar109._0_4_ = (float)local_4b0._0_4_ * fVar47;
  auVar109._4_4_ = (float)local_4b0._4_4_ * fVar58;
  auVar109._8_4_ = fStack_4a8 * fVar61;
  auVar109._12_4_ = fStack_4a4 * fVar64;
  auVar40._0_4_ = auVar147._0_4_ * fVar59 * auVar109._0_4_ + auVar38._0_4_;
  auVar40._4_4_ = auVar147._4_4_ * fVar15 * auVar109._4_4_ + auVar38._4_4_;
  auVar40._8_4_ = auVar147._8_4_ * fVar21 * auVar109._8_4_ + auVar38._8_4_;
  auVar40._12_4_ = auVar147._12_4_ * fVar27 * auVar109._12_4_ + auVar38._12_4_;
  auVar66._0_4_ = (float)local_250._0_4_ * (fVar130 * fVar130 + fVar56 * fVar56 + fVar45 * fVar45);
  auVar66._4_4_ = (float)local_250._4_4_ * (fVar137 * fVar137 + fVar14 * fVar14 + fVar13 * fVar13);
  auVar66._8_4_ = fStack_248 * (fVar140 * fVar140 + fVar20 * fVar20 + fVar19 * fVar19);
  auVar66._12_4_ = fStack_244 * (fVar143 * fVar143 + fVar26 * fVar26 + fVar25 * fVar25);
  auVar121._0_4_ = fVar149 * fVar149 * fVar87;
  auVar121._4_4_ = fVar152 * fVar152 * fVar91;
  auVar121._8_4_ = fVar153 * fVar153 * fVar92;
  auVar121._12_4_ = fVar154 * fVar154 * fVar93;
  auVar38 = vsubps_avx(auVar66,auVar121);
  auVar122._0_4_ = (fVar59 + fVar59) * fVar149;
  auVar122._4_4_ = (fVar15 + fVar15) * fVar152;
  auVar122._8_4_ = (fVar21 + fVar21) * fVar153;
  auVar122._12_4_ = (fVar27 + fVar27) * fVar154;
  auVar39 = vsubps_avx(auVar122,auVar109);
  fVar131 = auVar147._0_4_ * auVar147._0_4_;
  fVar138 = auVar147._4_4_ * auVar147._4_4_;
  fVar141 = auVar147._8_4_ * auVar147._8_4_;
  fVar144 = auVar147._12_4_ * auVar147._12_4_;
  auVar110._0_4_ = fVar131 * fVar87;
  auVar110._4_4_ = fVar138 * fVar91;
  auVar110._8_4_ = fVar141 * fVar92;
  auVar110._12_4_ = fVar144 * fVar93;
  auVar48 = vsubps_avx(_local_250,auVar110);
  auVar67._0_4_ = auVar48._0_4_ * (auVar38._0_4_ + auVar39._0_4_ * auVar109._0_4_);
  auVar67._4_4_ = auVar48._4_4_ * (auVar38._4_4_ + auVar39._4_4_ * auVar109._4_4_);
  auVar67._8_4_ = auVar48._8_4_ * (auVar38._8_4_ + auVar39._8_4_ * auVar109._8_4_);
  auVar67._12_4_ = auVar48._12_4_ * (auVar38._12_4_ + auVar39._12_4_ * auVar109._12_4_);
  auVar123._0_4_ = auVar40._0_4_ * auVar40._0_4_;
  auVar123._4_4_ = auVar40._4_4_ * auVar40._4_4_;
  auVar123._8_4_ = auVar40._8_4_ * auVar40._8_4_;
  auVar123._12_4_ = auVar40._12_4_ * auVar40._12_4_;
  auVar39 = vsubps_avx(auVar123,auVar67);
  auVar66 = ZEXT416(0) << 0x20;
  auVar38 = vcmpps_avx(auVar39,auVar66,5);
  auVar65 = auVar38 & ~auVar51;
  if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0') {
    auVar65 = vandnps_avx(auVar51,auVar38);
    auVar67 = vsubps_avx(auVar151,_local_480);
    auVar75 = vsubps_avx(auVar125,auVar133);
    auVar76 = vsubps_avx(auVar76,auVar120);
    auVar51 = vsqrtps_avx(auVar39);
    auVar38 = vrcpps_avx(auVar48);
    fVar132 = auVar38._0_4_;
    auVar158._0_4_ = fVar132 * auVar48._0_4_;
    fVar139 = auVar38._4_4_;
    auVar158._4_4_ = fVar139 * auVar48._4_4_;
    fVar142 = auVar38._8_4_;
    auVar158._8_4_ = fVar142 * auVar48._8_4_;
    fVar145 = auVar38._12_4_;
    auVar158._12_4_ = fVar145 * auVar48._12_4_;
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar79,auVar158);
    fVar132 = fVar132 + fVar132 * auVar38._0_4_;
    fVar139 = fVar139 + fVar139 * auVar38._4_4_;
    fVar142 = fVar142 + fVar142 * auVar38._8_4_;
    fVar145 = fVar145 + fVar145 * auVar38._12_4_;
    auVar159._8_4_ = 0x7fffffff;
    auVar159._0_8_ = 0x7fffffff7fffffff;
    auVar159._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx(auVar159,auVar48);
    auVar160._8_4_ = 0x219392ef;
    auVar160._0_8_ = 0x219392ef219392ef;
    auVar160._12_4_ = 0x219392ef;
    auVar38 = vcmpps_avx(auVar38,auVar160,2);
    uVar32 = CONCAT44(auVar40._4_4_,auVar40._0_4_);
    auVar161._0_8_ = uVar32 ^ 0x8000000080000000;
    auVar161._8_4_ = -auVar40._8_4_;
    auVar161._12_4_ = -auVar40._12_4_;
    auVar39 = vsubps_avx(auVar161,auVar51);
    auVar51 = vsubps_avx(auVar51,auVar40);
    auVar126._0_4_ = auVar39._0_4_ * fVar132;
    auVar126._4_4_ = auVar39._4_4_ * fVar139;
    auVar126._8_4_ = auVar39._8_4_ * fVar142;
    auVar126._12_4_ = auVar39._12_4_ * fVar145;
    auVar41._0_4_ = fVar132 * auVar51._0_4_;
    auVar41._4_4_ = fVar139 * auVar51._4_4_;
    auVar41._8_4_ = fVar142 * auVar51._8_4_;
    auVar41._12_4_ = fVar145 * auVar51._12_4_;
    auVar89._8_4_ = 0xff800000;
    auVar89._0_8_ = 0xff800000ff800000;
    auVar89._12_4_ = 0xff800000;
    auVar51 = vblendvps_avx(auVar126,auVar89,auVar38);
    auVar162._8_4_ = 0x7f800000;
    auVar162._0_8_ = 0x7f8000007f800000;
    auVar162._12_4_ = 0x7f800000;
    auVar39 = vblendvps_avx(auVar41,auVar162,auVar38);
    auVar127._0_4_ = fVar149 + auVar147._0_4_ * auVar51._0_4_;
    auVar127._4_4_ = fVar152 + auVar147._4_4_ * auVar51._4_4_;
    auVar127._8_4_ = fVar153 + auVar147._8_4_ * auVar51._8_4_;
    auVar127._12_4_ = fVar154 + auVar147._12_4_ * auVar51._12_4_;
    auVar38 = vcmpps_avx(auVar127,auVar66,6);
    auVar28._4_4_ = fVar58;
    auVar28._0_4_ = fVar47;
    auVar28._8_4_ = fVar61;
    auVar28._12_4_ = fVar64;
    auVar48 = vcmpps_avx(auVar127,auVar28,1);
    auVar38 = vandps_avx(auVar48,auVar38);
    auVar38 = vandps_avx(auVar65,auVar38);
    local_410 = vblendvps_avx(auVar162,auVar51,auVar38);
    local_350._0_4_ = fVar149 + auVar147._0_4_ * auVar39._0_4_;
    local_350._4_4_ = fVar152 + auVar147._4_4_ * auVar39._4_4_;
    fStack_348 = fVar153 + auVar147._8_4_ * auVar39._8_4_;
    fStack_344 = fVar154 + auVar147._12_4_ * auVar39._12_4_;
    auVar38 = vcmpps_avx(_local_350,auVar66,6);
    auVar51 = vcmpps_avx(_local_350,auVar28,1);
    auVar38 = vandps_avx(auVar51,auVar38);
    auVar38 = vandps_avx(auVar65,auVar38);
    auVar48 = vblendvps_avx(auVar89,auVar39,auVar38);
    auVar38 = vrcpps_avx(auVar147);
    fVar132 = auVar38._0_4_;
    auVar96._0_4_ = auVar147._0_4_ * fVar132;
    fVar139 = auVar38._4_4_;
    auVar96._4_4_ = auVar147._4_4_ * fVar139;
    fVar142 = auVar38._8_4_;
    auVar96._8_4_ = auVar147._8_4_ * fVar142;
    fVar145 = auVar38._12_4_;
    auVar96._12_4_ = auVar147._12_4_ * fVar145;
    auVar38 = vsubps_avx(auVar79,auVar96);
    fVar132 = fVar132 + fVar132 * auVar38._0_4_;
    fVar139 = fVar139 + fVar139 * auVar38._4_4_;
    fVar142 = fVar142 + fVar142 * auVar38._8_4_;
    fVar145 = fVar145 + fVar145 * auVar38._12_4_;
    auVar97._0_4_ = auVar147._0_4_ * fVar130;
    auVar97._4_4_ = auVar147._4_4_ * fVar137;
    auVar97._8_4_ = auVar147._8_4_ * fVar140;
    auVar97._12_4_ = auVar147._12_4_ * fVar143;
    auVar111._0_4_ = local_220 * fVar149;
    auVar111._4_4_ = local_220 * fVar152;
    auVar111._8_4_ = local_220 * fVar153;
    auVar111._12_4_ = local_220 * fVar154;
    auVar38 = vsubps_avx(auVar97,auVar111);
    auVar112._0_4_ = auVar147._0_4_ * fVar56;
    auVar112._4_4_ = auVar147._4_4_ * fVar14;
    auVar112._8_4_ = auVar147._8_4_ * fVar20;
    auVar112._12_4_ = auVar147._12_4_ * fVar26;
    auVar134._0_4_ = local_230 * fVar149;
    auVar134._4_4_ = local_230 * fVar152;
    auVar134._8_4_ = local_230 * fVar153;
    auVar134._12_4_ = local_230 * fVar154;
    auVar51 = vsubps_avx(auVar112,auVar134);
    auVar135._0_4_ = auVar147._0_4_ * fVar45;
    auVar135._4_4_ = auVar147._4_4_ * fVar13;
    auVar135._8_4_ = auVar147._8_4_ * fVar19;
    auVar135._12_4_ = auVar147._12_4_ * fVar25;
    auVar80._0_4_ = fStack_39c * fVar149;
    auVar80._4_4_ = fStack_39c * fVar152;
    auVar80._8_4_ = fStack_39c * fVar153;
    auVar80._12_4_ = fStack_39c * fVar154;
    auVar39 = vsubps_avx(auVar135,auVar80);
    auVar81._0_4_ =
         auVar38._0_4_ * auVar38._0_4_ +
         auVar51._0_4_ * auVar51._0_4_ + auVar39._0_4_ * auVar39._0_4_;
    auVar81._4_4_ =
         auVar38._4_4_ * auVar38._4_4_ +
         auVar51._4_4_ * auVar51._4_4_ + auVar39._4_4_ * auVar39._4_4_;
    auVar81._8_4_ =
         auVar38._8_4_ * auVar38._8_4_ +
         auVar51._8_4_ * auVar51._8_4_ + auVar39._8_4_ * auVar39._8_4_;
    auVar81._12_4_ =
         auVar38._12_4_ * auVar38._12_4_ +
         auVar51._12_4_ * auVar51._12_4_ + auVar39._12_4_ * auVar39._12_4_;
    auVar98._0_4_ = fVar131 * (float)local_4b0._0_4_ * (float)local_4b0._0_4_;
    auVar98._4_4_ = fVar138 * (float)local_4b0._4_4_ * (float)local_4b0._4_4_;
    auVar98._8_4_ = fVar141 * fStack_4a8 * fStack_4a8;
    auVar98._12_4_ = fVar144 * fStack_4a4 * fStack_4a4;
    auVar38 = vcmpps_avx(auVar81,auVar98,1);
    auVar99._0_4_ = fVar132 * -fVar149;
    auVar99._4_4_ = fVar139 * -fVar152;
    auVar99._8_4_ = fVar142 * -fVar153;
    auVar99._12_4_ = fVar145 * -fVar154;
    auVar51 = vblendvps_avx(auVar162,auVar99,auVar38);
    local_470._0_4_ = auVar67._0_4_;
    local_470._4_4_ = auVar67._4_4_;
    fStack_468 = auVar67._8_4_;
    fStack_464 = auVar67._12_4_;
    fVar149 = fVar157 * (float)local_470._0_4_ + auVar75._0_4_ * fVar106 + auVar76._0_4_ * fVar94;
    fVar152 = fVar12 * (float)local_470._4_4_ + auVar75._4_4_ * fVar164 + auVar76._4_4_ * fVar62;
    fVar153 = fVar18 * fStack_468 + auVar75._8_4_ * fVar17 + auVar76._8_4_ * fVar16;
    fVar154 = fVar24 * fStack_464 + auVar75._12_4_ * fVar23 + auVar76._12_4_ * fVar22;
    auVar38 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar65);
    local_3b0 = vblendvps_avx(auVar162,auVar51,auVar38);
    auVar82._0_4_ = auVar147._0_4_ * (float)local_470._0_4_;
    auVar82._4_4_ = auVar147._4_4_ * (float)local_470._4_4_;
    auVar82._8_4_ = auVar147._8_4_ * fStack_468;
    auVar82._12_4_ = auVar147._12_4_ * fStack_464;
    auVar77._0_4_ = auVar147._0_4_ * auVar75._0_4_;
    auVar77._4_4_ = auVar147._4_4_ * auVar75._4_4_;
    auVar77._8_4_ = auVar147._8_4_ * auVar75._8_4_;
    auVar77._12_4_ = auVar147._12_4_ * auVar75._12_4_;
    auVar49._0_4_ = auVar147._0_4_ * auVar76._0_4_;
    auVar49._4_4_ = auVar147._4_4_ * auVar76._4_4_;
    auVar49._8_4_ = auVar147._8_4_ * auVar76._8_4_;
    auVar49._12_4_ = auVar147._12_4_ * auVar76._12_4_;
    auVar100._0_4_ = local_220 * fVar149;
    auVar100._4_4_ = local_220 * fVar152;
    auVar100._8_4_ = local_220 * fVar153;
    auVar100._12_4_ = local_220 * fVar154;
    auVar38 = vsubps_avx(auVar82,auVar100);
    auVar101._0_4_ = local_230 * fVar149;
    auVar101._4_4_ = local_230 * fVar152;
    auVar101._8_4_ = local_230 * fVar153;
    auVar101._12_4_ = local_230 * fVar154;
    auVar51 = vsubps_avx(auVar77,auVar101);
    auVar102._0_4_ = fStack_39c * fVar149;
    auVar102._4_4_ = fStack_39c * fVar152;
    auVar102._8_4_ = fStack_39c * fVar153;
    auVar102._12_4_ = fStack_39c * fVar154;
    auVar39 = vsubps_avx(auVar49,auVar102);
    auVar50._0_4_ =
         auVar38._0_4_ * auVar38._0_4_ +
         auVar51._0_4_ * auVar51._0_4_ + auVar39._0_4_ * auVar39._0_4_;
    auVar50._4_4_ =
         auVar38._4_4_ * auVar38._4_4_ +
         auVar51._4_4_ * auVar51._4_4_ + auVar39._4_4_ * auVar39._4_4_;
    auVar50._8_4_ =
         auVar38._8_4_ * auVar38._8_4_ +
         auVar51._8_4_ * auVar51._8_4_ + auVar39._8_4_ * auVar39._8_4_;
    auVar50._12_4_ =
         auVar38._12_4_ * auVar38._12_4_ +
         auVar51._12_4_ * auVar51._12_4_ + auVar39._12_4_ * auVar39._12_4_;
    auVar38 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar65);
    auVar83._0_4_ = fVar131 * auVar37._0_4_ * auVar37._0_4_;
    auVar83._4_4_ = fVar138 * auVar37._4_4_ * auVar37._4_4_;
    auVar83._8_4_ = fVar141 * auVar37._8_4_ * auVar37._8_4_;
    auVar83._12_4_ = fVar144 * auVar37._12_4_ * auVar37._12_4_;
    auVar51 = vcmpps_avx(auVar50,auVar83,1);
    auVar42._0_4_ = fVar132 * -fVar149;
    auVar42._4_4_ = fVar139 * -fVar152;
    auVar42._8_4_ = fVar142 * -fVar153;
    auVar42._12_4_ = fVar145 * -fVar154;
    auVar51 = vblendvps_avx(auVar162,auVar42,auVar51);
    auVar38 = vblendvps_avx(auVar162,auVar51,auVar38);
    auVar37 = vminps_avx(local_3b0,auVar38);
    auVar51 = vmaxps_avx(local_3b0,auVar38);
    auVar40 = vminps_avx(local_410,auVar37);
    auVar39 = vcmpps_avx(auVar40,auVar37,0);
    auVar38 = vcmpps_avx(auVar162,auVar51,0);
    auVar113._8_4_ = 0xff800000;
    auVar113._0_8_ = 0xff800000ff800000;
    auVar113._12_4_ = 0xff800000;
    auVar38 = vblendvps_avx(auVar51,auVar113,auVar38);
    auVar51 = vcmpps_avx(auVar162,auVar37,0);
    auVar51 = vblendvps_avx(auVar37,auVar113,auVar51);
    auVar38 = vblendvps_avx(auVar51,auVar38,auVar39);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar68._4_4_ = uVar1;
    auVar68._0_4_ = uVar1;
    auVar68._8_4_ = uVar1;
    auVar68._12_4_ = uVar1;
    local_1a0 = vmaxps_avx(auVar48,auVar38);
    auVar51._0_4_ = fVar46 + auVar40._0_4_;
    auVar51._4_4_ = fVar57 + auVar40._4_4_;
    auVar51._8_4_ = fVar60 + auVar40._8_4_;
    auVar51._12_4_ = fVar63 + auVar40._12_4_;
    auVar38 = vcmpps_avx(auVar68,auVar51,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_470._4_4_ = uVar1;
    local_470._0_4_ = uVar1;
    fStack_468 = (float)uVar1;
    fStack_464 = (float)uVar1;
    auVar51 = vcmpps_avx(auVar51,_local_470,2);
    auVar38 = vandps_avx(auVar38,auVar51);
    auVar51 = vcmpps_avx(auVar162,auVar40,4);
    local_2c0 = vandps_avx(auVar38,auVar51);
    local_3c0._0_4_ = fVar46 + local_1a0._0_4_;
    local_3c0._4_4_ = fVar57 + local_1a0._4_4_;
    local_3c0._8_4_ = fVar60 + local_1a0._8_4_;
    local_3c0._12_4_ = fVar63 + local_1a0._12_4_;
    auVar38 = vcmpps_avx(auVar68,local_3c0,2);
    auVar51 = vcmpps_avx(local_3c0,_local_470,2);
    auVar38 = vandps_avx(auVar38,auVar51);
    auVar51 = vandps_avx(local_2c0,auVar65);
    auVar39 = vcmpps_avx(local_1a0,auVar113,4);
    auVar39 = vandps_avx(auVar65,auVar39);
    local_190 = vandps_avx(auVar38,auVar39);
    auVar38 = vorps_avx(auVar51,local_190);
    uVar31 = vmovmskps_avx(auVar38);
    if (uVar31 != 0) {
      auVar39 = vblendvps_avx(local_1a0,auVar40,auVar51);
      auVar37 = vblendvps_avx(_local_350,auVar127,auVar51);
      auVar29._4_4_ = fVar58;
      auVar29._0_4_ = fVar47;
      auVar29._8_4_ = fVar61;
      auVar29._12_4_ = fVar64;
      auVar38 = vrcpps_avx(auVar29);
      local_420 = auVar38._0_4_;
      auVar78._0_4_ = fVar47 * local_420;
      fStack_41c = auVar38._4_4_;
      auVar78._4_4_ = fVar58 * fStack_41c;
      fStack_418 = auVar38._8_4_;
      auVar78._8_4_ = fVar61 * fStack_418;
      fStack_414 = auVar38._12_4_;
      auVar78._12_4_ = fVar64 * fStack_414;
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = 0x3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar128,auVar78);
      local_420 = local_420 + local_420 * auVar38._0_4_;
      fStack_41c = fStack_41c + fStack_41c * auVar38._4_4_;
      fStack_418 = fStack_418 + fStack_418 * auVar38._8_4_;
      fStack_414 = fStack_414 + fStack_414 * auVar38._12_4_;
      local_4b0._0_4_ = fVar47 * fVar59 * (float)local_4b0._0_4_;
      local_4b0._4_4_ = fVar58 * fVar15 * (float)local_4b0._4_4_;
      fStack_4a8 = fVar61 * fVar21 * fStack_4a8;
      fStack_4a4 = fVar64 * fVar27 * fStack_4a4;
      local_340 = fVar106 * (float)local_4b0._0_4_;
      fStack_33c = fVar164 * (float)local_4b0._4_4_;
      fStack_338 = fVar17 * fStack_4a8;
      fStack_334 = fVar23 * fStack_4a4;
      auVar38 = vcmpps_avx(auVar39,local_410,0);
      auVar51 = vcmpps_avx(auVar39,auVar48,0);
      auVar38 = vorps_avx(auVar38,auVar51);
      auVar38 = vandps_avx(auVar65,auVar38);
      auVar51 = vcmpps_avx(auVar39,local_3b0,0);
      auVar51 = vandps_avx(auVar65,auVar51);
      fVar59 = auVar39._0_4_;
      fVar21 = auVar39._4_4_;
      fVar47 = auVar39._8_4_;
      fVar61 = auVar39._12_4_;
      auVar84._0_4_ =
           fVar157 * (float)local_4b0._0_4_ +
           (float)local_250._0_4_ * (local_220 * fVar59 + fVar130);
      auVar84._4_4_ =
           fVar12 * (float)local_4b0._4_4_ + (float)local_250._4_4_ * (local_220 * fVar21 + fVar137)
      ;
      auVar84._8_4_ = fVar18 * fStack_4a8 + fStack_248 * (local_220 * fVar47 + fVar140);
      auVar84._12_4_ = fVar24 * fStack_4a4 + fStack_244 * (local_220 * fVar61 + fVar143);
      fStack_3cc = fVar12 * fVar91;
      local_3d0 = fVar157 * fVar87;
      fStack_3c8 = fVar18 * fVar92;
      fStack_3c4 = fVar24 * fVar93;
      fVar15 = auVar37._0_4_;
      auVar103._0_4_ = fVar157 * fVar87 * fVar15;
      fVar27 = auVar37._4_4_;
      auVar103._4_4_ = fVar12 * fVar91 * fVar27;
      fVar58 = auVar37._8_4_;
      auVar103._8_4_ = fVar18 * fVar92 * fVar58;
      fVar64 = auVar37._12_4_;
      auVar103._12_4_ = fVar24 * fVar93 * fVar64;
      auVar65 = vsubps_avx(auVar84,auVar103);
      local_1b0._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
      local_1b0._8_4_ = -fVar18;
      local_1b0._12_4_ = -fVar24;
      auVar39 = vblendvps_avx(local_240,local_1b0,auVar51);
      local_280 = vblendvps_avx(auVar39,auVar65,auVar38);
      auVar104._0_4_ = local_340 + (float)local_250._0_4_ * (local_230 * fVar59 + fVar56);
      auVar104._4_4_ = fStack_33c + (float)local_250._4_4_ * (local_230 * fVar21 + fVar14);
      auVar104._8_4_ = fStack_338 + fStack_248 * (local_230 * fVar47 + fVar20);
      auVar104._12_4_ = fStack_334 + fStack_244 * (local_230 * fVar61 + fVar26);
      fStack_2dc = fVar164 * fVar91;
      local_2e0 = fVar106 * fVar87;
      fStack_2d8 = fVar17 * fVar92;
      fStack_2d4 = fVar23 * fVar93;
      auVar114._0_4_ = fVar15 * fVar106 * fVar87;
      auVar114._4_4_ = fVar27 * fVar164 * fVar91;
      auVar114._8_4_ = fVar58 * fVar17 * fVar92;
      auVar114._12_4_ = fVar64 * fVar23 * fVar93;
      auVar65 = vsubps_avx(auVar104,auVar114);
      local_1c0._0_8_ = local_310._0_8_ ^ 0x8000000080000000;
      local_1c0._8_4_ = -fVar17;
      local_1c0._12_4_ = -fVar23;
      auVar39 = vblendvps_avx(local_310,local_1c0,auVar51);
      local_270 = vblendvps_avx(auVar39,auVar65,auVar38);
      auVar124 = ZEXT1664(local_320);
      local_2d0 = fVar94 * (float)local_4b0._0_4_;
      fStack_2cc = fVar62 * (float)local_4b0._4_4_;
      fStack_2c8 = fVar16 * fStack_4a8;
      fStack_2c4 = fVar22 * fStack_4a4;
      auVar156 = ZEXT1664(CONCAT412(fVar22 * fVar93,
                                    CONCAT48(fVar16 * fVar92,
                                             CONCAT44(fVar62 * fVar91,fVar94 * fVar87))));
      auVar69._0_4_ = local_2d0 + (float)local_250._0_4_ * (fVar45 + fVar59 * fStack_39c);
      auVar69._4_4_ = fStack_2cc + (float)local_250._4_4_ * (fVar13 + fVar21 * fStack_39c);
      auVar69._8_4_ = fStack_2c8 + fStack_248 * (fVar19 + fVar47 * fStack_39c);
      auVar69._12_4_ = fStack_2c4 + fStack_244 * (fVar25 + fVar61 * fStack_39c);
      local_1d0._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
      local_1d0._8_4_ = -fVar16;
      local_1d0._12_4_ = -fVar22;
      auVar115._0_4_ = fVar94 * fVar87 * fVar15;
      auVar115._4_4_ = fVar62 * fVar91 * fVar27;
      auVar115._8_4_ = fVar16 * fVar92 * fVar58;
      auVar115._12_4_ = fVar22 * fVar93 * fVar64;
      auVar39 = vblendvps_avx(local_320,local_1d0,auVar51);
      auVar65 = vsubps_avx(auVar69,auVar115);
      local_260 = vblendvps_avx(auVar39,auVar65,auVar38);
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar51 = vandnps_avx(auVar51,auVar52);
      auVar136 = ZEXT1664(auVar51);
      auVar53._0_4_ = fVar15 * local_420;
      auVar53._4_4_ = fVar27 * fStack_41c;
      auVar53._8_4_ = fVar58 * fStack_418;
      auVar53._12_4_ = fVar64 * fStack_414;
      local_2b0 = vblendvps_avx(auVar51,auVar53,auVar38);
      auVar163 = ZEXT864(0) << 0x20;
      local_2a0 = ZEXT816(0) << 0x20;
      local_290._4_4_ = fVar21 + fVar57;
      local_290._0_4_ = fVar59 + fVar46;
      fStack_288 = fVar47 + fVar60;
      fStack_284 = fVar61 + fVar63;
      uVar33 = 1 << ((byte)k & 0x1f);
      uVar32 = (ulong)(uVar31 & 0xff);
      auVar119 = ZEXT1664(local_310);
      auVar148 = ZEXT1664(auVar74);
      auVar155 = ZEXT1664(local_330);
      auVar129 = ZEXT1664(_local_440);
      local_430 = pSVar34;
      local_428 = ray;
      local_388 = line;
      do {
        local_380.valid = (int *)local_460;
        auVar51 = auVar124._0_16_;
        auVar38 = auVar119._0_16_;
        auVar39 = auVar136._0_16_;
        auVar40 = auVar156._0_16_;
        auVar37 = auVar155._0_16_;
        auVar65 = auVar148._0_16_;
        auVar74 = auVar129._0_16_;
        uVar11 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar31 = *(uint *)(local_210 + uVar11 * 4);
        pGVar6 = (pSVar34->geometries).items[uVar31].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar35 = true, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00eee89b;
          local_120 = *(undefined4 *)(local_2b0 + uVar11 * 4);
          local_100 = *(undefined4 *)(local_2a0 + uVar11 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_290 + uVar11 * 4);
          local_380.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar31),0);
          local_e0 = (local_388->primIDs).field_0.i[uVar11];
          local_180 = *(undefined4 *)(local_280 + uVar11 * 4);
          uVar2 = *(undefined4 *)(local_270 + uVar11 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_260 + uVar11 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          auVar71 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_9c = (local_380.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_380.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_460 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar33 & 0xf) << 4));
          local_450 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar33 >> 4) * 0x10);
          local_380.geometryUserPtr = pGVar6->userPtr;
          local_380.hit = (RTCHitN *)&local_180;
          local_380.N = 8;
          local_380.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_300 = auVar39;
            local_2f0 = auVar40;
            local_200 = auVar71;
            (*pGVar6->occlusionFilterN)(&local_380);
            auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar136 = ZEXT1664(local_300);
            auVar156 = ZEXT1664(local_2f0);
            auVar129 = ZEXT1664(_local_440);
            auVar155 = ZEXT1664(local_330);
            auVar148 = ZEXT1664(local_400._0_16_);
            auVar124 = ZEXT1664(local_320);
            auVar119 = ZEXT1664(local_310);
            pSVar34 = local_430;
            auVar71 = local_200;
          }
          auVar38 = vpcmpeqd_avx(auVar163._0_16_,local_460);
          auVar51 = vpcmpeqd_avx(auVar163._0_16_,local_450);
          auVar70._16_16_ = auVar51;
          auVar70._0_16_ = auVar38;
          auVar70 = auVar71 & ~auVar70;
          if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar70 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar70 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar70 >> 0x7f,0) == '\0') &&
                (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar70 >> 0xbf,0) == '\0') &&
              (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar70[0x1f]) {
            auVar43._0_4_ = auVar38._0_4_ ^ auVar71._0_4_;
            auVar43._4_4_ = auVar38._4_4_ ^ auVar71._4_4_;
            auVar43._8_4_ = auVar38._8_4_ ^ auVar71._8_4_;
            auVar43._12_4_ = auVar38._12_4_ ^ auVar71._12_4_;
            auVar43._16_4_ = auVar51._0_4_ ^ auVar71._16_4_;
            auVar43._20_4_ = auVar51._4_4_ ^ auVar71._20_4_;
            auVar43._24_4_ = auVar51._8_4_ ^ auVar71._24_4_;
            auVar43._28_4_ = auVar51._12_4_ ^ auVar71._28_4_;
          }
          else {
            p_Var10 = context->args->filter;
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              local_2f0 = auVar156._0_16_;
              local_300 = auVar136._0_16_;
              local_200 = auVar71;
              (*p_Var10)(&local_380);
              auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar136 = ZEXT1664(local_300);
              auVar156 = ZEXT1664(local_2f0);
              auVar129 = ZEXT1664(_local_440);
              auVar155 = ZEXT1664(local_330);
              auVar148 = ZEXT1664(local_400._0_16_);
              auVar124 = ZEXT1664(local_320);
              auVar119 = ZEXT1664(local_310);
              pSVar34 = local_430;
              auVar71 = local_200;
            }
            auVar38 = vpcmpeqd_avx(auVar163._0_16_,local_460);
            auVar51 = vpcmpeqd_avx(auVar163._0_16_,local_450);
            auVar54._16_16_ = auVar51;
            auVar54._0_16_ = auVar38;
            auVar43._0_4_ = auVar38._0_4_ ^ auVar71._0_4_;
            auVar43._4_4_ = auVar38._4_4_ ^ auVar71._4_4_;
            auVar43._8_4_ = auVar38._8_4_ ^ auVar71._8_4_;
            auVar43._12_4_ = auVar38._12_4_ ^ auVar71._12_4_;
            auVar43._16_4_ = auVar51._0_4_ ^ auVar71._16_4_;
            auVar43._20_4_ = auVar51._4_4_ ^ auVar71._20_4_;
            auVar43._24_4_ = auVar51._8_4_ ^ auVar71._24_4_;
            auVar43._28_4_ = auVar51._12_4_ ^ auVar71._28_4_;
            auVar71._8_4_ = 0xff800000;
            auVar71._0_8_ = 0xff800000ff800000;
            auVar71._12_4_ = 0xff800000;
            auVar71._16_4_ = 0xff800000;
            auVar71._20_4_ = 0xff800000;
            auVar71._24_4_ = 0xff800000;
            auVar71._28_4_ = 0xff800000;
            auVar71 = vblendvps_avx(auVar71,*(undefined1 (*) [32])(local_380.ray + 0x100),auVar54);
            *(undefined1 (*) [32])(local_380.ray + 0x100) = auVar71;
          }
          auVar51 = auVar124._0_16_;
          auVar38 = auVar119._0_16_;
          auVar39 = auVar136._0_16_;
          auVar40 = auVar156._0_16_;
          auVar37 = auVar155._0_16_;
          auVar65 = auVar148._0_16_;
          auVar74 = auVar129._0_16_;
          if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar43 >> 0x7f,0) != '\0') ||
                (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar43 >> 0xbf,0) != '\0') ||
              (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar43[0x1f] < '\0') {
            _local_470 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
            bVar35 = true;
            goto LAB_00eee89b;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
        }
        auVar51 = auVar124._0_16_;
        auVar38 = auVar119._0_16_;
        auVar39 = auVar136._0_16_;
        auVar40 = auVar156._0_16_;
        auVar37 = auVar155._0_16_;
        auVar65 = auVar148._0_16_;
        auVar74 = auVar129._0_16_;
        uVar32 = uVar32 ^ 1L << (uVar11 & 0x3f);
      } while (uVar32 != 0);
      bVar35 = false;
LAB_00eee89b:
      auVar66 = vpermilps_avx(_local_470,0);
      auVar67 = vcmpps_avx(local_3c0,auVar66,2);
      auVar66 = vandps_avx(local_190,local_2c0);
      auVar66 = vandps_avx(auVar66,auVar67);
      uVar31 = vmovmskps_avx(auVar66);
      if (uVar31 == 0) {
        return bVar35;
      }
      auVar67 = vcmpps_avx(local_1a0,local_3b0,0);
      auVar66 = vblendvps_avx(local_240,local_1b0,auVar67);
      auVar38 = vblendvps_avx(auVar38,local_1c0,auVar67);
      auVar51 = vblendvps_avx(auVar51,local_1d0,auVar67);
      auVar67 = vcmpps_avx(local_1a0,local_410,0);
      auVar48 = vcmpps_avx(local_1a0,auVar48,0);
      auVar48 = vorps_avx(auVar67,auVar48);
      fVar94 = local_1a0._0_4_;
      fVar106 = local_1a0._4_4_;
      fVar45 = local_1a0._8_4_;
      fVar56 = local_1a0._12_4_;
      auVar85._0_4_ =
           (float)local_250._0_4_ * (auVar74._0_4_ + fVar94 * local_220) +
           fVar157 * (float)local_4b0._0_4_;
      auVar85._4_4_ =
           (float)local_250._4_4_ * (auVar74._4_4_ + fVar106 * fStack_21c) +
           fVar12 * (float)local_4b0._4_4_;
      auVar85._8_4_ = fStack_248 * (auVar74._8_4_ + fVar45 * fStack_218) + fVar18 * fStack_4a8;
      auVar85._12_4_ = fStack_244 * (auVar74._12_4_ + fVar56 * fStack_214) + fVar24 * fStack_4a4;
      auVar90._0_4_ = (float)local_250._0_4_ * (auVar65._0_4_ + fVar94 * local_230) + local_340;
      auVar90._4_4_ = (float)local_250._4_4_ * (auVar65._4_4_ + fVar106 * fStack_22c) + fStack_33c;
      auVar90._8_4_ = fStack_248 * (auVar65._8_4_ + fVar45 * fStack_228) + fStack_338;
      auVar90._12_4_ = fStack_244 * (auVar65._12_4_ + fVar56 * fStack_224) + fStack_334;
      auVar105._0_4_ = (float)local_250._0_4_ * (auVar37._0_4_ + fVar94 * local_3a0) + local_2d0;
      auVar105._4_4_ = (float)local_250._4_4_ * (auVar37._4_4_ + fVar106 * fStack_39c) + fStack_2cc;
      auVar105._8_4_ = fStack_248 * (auVar37._8_4_ + fVar45 * fStack_398) + fStack_2c8;
      auVar105._12_4_ = fStack_244 * (auVar37._12_4_ + fVar56 * fStack_394) + fStack_2c4;
      auVar116._0_4_ = (float)local_350._0_4_ * local_3d0;
      auVar116._4_4_ = (float)local_350._4_4_ * fStack_3cc;
      auVar116._8_4_ = fStack_348 * fStack_3c8;
      auVar116._12_4_ = fStack_344 * fStack_3c4;
      auVar74 = vsubps_avx(auVar85,auVar116);
      auVar117._0_4_ = (float)local_350._0_4_ * local_2e0;
      auVar117._4_4_ = (float)local_350._4_4_ * fStack_2dc;
      auVar117._8_4_ = fStack_348 * fStack_2d8;
      auVar117._12_4_ = fStack_344 * fStack_2d4;
      auVar65 = vsubps_avx(auVar90,auVar117);
      auVar118._0_4_ = auVar40._0_4_ * (float)local_350._0_4_;
      auVar118._4_4_ = auVar40._4_4_ * (float)local_350._4_4_;
      auVar118._8_4_ = auVar40._8_4_ * fStack_348;
      auVar118._12_4_ = auVar40._12_4_ * fStack_344;
      auVar37 = vsubps_avx(auVar105,auVar118);
      local_280 = vblendvps_avx(auVar66,auVar74,auVar48);
      local_270 = vblendvps_avx(auVar38,auVar65,auVar48);
      local_260 = vblendvps_avx(auVar51,auVar37,auVar48);
      auVar86._0_4_ = (float)local_350._0_4_ * local_420;
      auVar86._4_4_ = (float)local_350._4_4_ * fStack_41c;
      auVar86._8_4_ = fStack_348 * fStack_418;
      auVar86._12_4_ = fStack_344 * fStack_414;
      local_2b0 = vblendvps_avx(auVar39,auVar86,auVar48);
      auVar119 = ZEXT464(0) << 0x20;
      local_2a0 = ZEXT416(0) << 0x20;
      _local_290 = local_3c0;
      pSVar34 = context->scene;
      uVar32 = (ulong)(uVar31 & 0xff);
      auVar124 = ZEXT864(0) << 0x20;
      do {
        local_380.valid = (int *)local_460;
        uVar11 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar31 = *(uint *)(local_210 + uVar11 * 4);
        pGVar6 = (pSVar34->geometries).items[uVar31].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar30 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00eeecf0;
          local_120 = *(undefined4 *)(local_2b0 + uVar11 * 4);
          local_100 = *(undefined4 *)(local_2a0 + uVar11 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_290 + uVar11 * 4);
          local_380.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar31),0);
          local_e0 = (local_388->primIDs).field_0.i[uVar11];
          local_180 = *(undefined4 *)(local_280 + uVar11 * 4);
          uVar1 = *(undefined4 *)(local_270 + uVar11 * 4);
          local_160._4_4_ = uVar1;
          local_160._0_4_ = uVar1;
          local_160._8_4_ = uVar1;
          local_160._12_4_ = uVar1;
          local_160._16_4_ = uVar1;
          local_160._20_4_ = uVar1;
          local_160._24_4_ = uVar1;
          local_160._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_260 + uVar11 * 4);
          local_140._4_4_ = uVar1;
          local_140._0_4_ = uVar1;
          local_140._8_4_ = uVar1;
          local_140._12_4_ = uVar1;
          local_140._16_4_ = uVar1;
          local_140._20_4_ = uVar1;
          local_140._24_4_ = uVar1;
          local_140._28_4_ = uVar1;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          local_400 = vcmpps_avx(auVar124._0_32_,auVar124._0_32_,0xf);
          uStack_9c = (local_380.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_380.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_460 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar33 & 0xf) << 4));
          local_450 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar33 >> 4) * 0x10);
          local_380.geometryUserPtr = pGVar6->userPtr;
          local_380.hit = (RTCHitN *)&local_180;
          local_380.N = 8;
          local_380.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&local_380);
            auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
            ray = local_428;
          }
          auVar38 = vpcmpeqd_avx(local_460,auVar119._0_16_);
          auVar51 = vpcmpeqd_avx(local_450,auVar119._0_16_);
          auVar72._16_16_ = auVar51;
          auVar72._0_16_ = auVar38;
          auVar71 = local_400 & ~auVar72;
          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar71 >> 0x7f,0) == '\0') &&
                (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar71 >> 0xbf,0) == '\0') &&
              (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar71[0x1f]) {
            auVar44._0_4_ = auVar38._0_4_ ^ local_400._0_4_;
            auVar44._4_4_ = auVar38._4_4_ ^ local_400._4_4_;
            auVar44._8_4_ = auVar38._8_4_ ^ local_400._8_4_;
            auVar44._12_4_ = auVar38._12_4_ ^ local_400._12_4_;
            auVar44._16_4_ = auVar51._0_4_ ^ local_400._16_4_;
            auVar44._20_4_ = auVar51._4_4_ ^ local_400._20_4_;
            auVar44._24_4_ = auVar51._8_4_ ^ local_400._24_4_;
            auVar44._28_4_ = auVar51._12_4_ ^ local_400._28_4_;
          }
          else {
            p_Var10 = context->args->filter;
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var10)(&local_380);
              auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
              ray = local_428;
            }
            auVar38 = vpcmpeqd_avx(local_460,auVar119._0_16_);
            auVar51 = vpcmpeqd_avx(local_450,auVar119._0_16_);
            auVar55._16_16_ = auVar51;
            auVar55._0_16_ = auVar38;
            auVar44._0_4_ = auVar38._0_4_ ^ local_400._0_4_;
            auVar44._4_4_ = auVar38._4_4_ ^ local_400._4_4_;
            auVar44._8_4_ = auVar38._8_4_ ^ local_400._8_4_;
            auVar44._12_4_ = auVar38._12_4_ ^ local_400._12_4_;
            auVar44._16_4_ = auVar51._0_4_ ^ local_400._16_4_;
            auVar44._20_4_ = auVar51._4_4_ ^ local_400._20_4_;
            auVar44._24_4_ = auVar51._8_4_ ^ local_400._24_4_;
            auVar44._28_4_ = auVar51._12_4_ ^ local_400._28_4_;
            auVar73._8_4_ = 0xff800000;
            auVar73._0_8_ = 0xff800000ff800000;
            auVar73._12_4_ = 0xff800000;
            auVar73._16_4_ = 0xff800000;
            auVar73._20_4_ = 0xff800000;
            auVar73._24_4_ = 0xff800000;
            auVar73._28_4_ = 0xff800000;
            auVar71 = vblendvps_avx(auVar73,*(undefined1 (*) [32])(local_380.ray + 0x100),auVar55);
            *(undefined1 (*) [32])(local_380.ray + 0x100) = auVar71;
          }
          if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0x7f,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar44 >> 0xbf,0) != '\0') ||
              (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar44[0x1f] < '\0') {
            bVar30 = 1;
            goto LAB_00eeecf0;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_470._0_4_;
        }
        uVar32 = uVar32 ^ 1L << (uVar11 & 0x3f);
        if (uVar32 == 0) {
          bVar30 = 0;
LAB_00eeecf0:
          return (bool)(bVar35 | bVar30);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }